

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FeatureTypes.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::ImageFeatureType_ImageSize::SharedCtor(ImageFeatureType_ImageSize *this)

{
  ImageFeatureType_ImageSize *this_local;
  
  memset(&this->width_,0,0x10);
  this->_cached_size_ = 0;
  return;
}

Assistant:

void ImageFeatureType_ImageSize::SharedCtor() {
  ::memset(&width_, 0, reinterpret_cast<char*>(&height_) -
    reinterpret_cast<char*>(&width_) + sizeof(height_));
  _cached_size_ = 0;
}